

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O0

void __thiscall RhombicCode::buildSyndromeIndices(RhombicCode *this)

{
  uint uVar1;
  pointer pLVar2;
  long in_RDI;
  double dVar3;
  double dVar4;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  cartesian4 coordinate;
  int i;
  pointer in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  uint in_stack_fffffffffffff874;
  allocator local_411;
  string local_410 [36];
  int local_3ec;
  _Base_ptr local_3e8;
  undefined1 local_3e0;
  allocator local_3d1;
  string local_3d0 [36];
  int local_3ac;
  _Base_ptr local_3a8;
  undefined1 local_3a0;
  allocator local_391;
  string local_390 [36];
  int local_36c;
  _Base_ptr local_368;
  undefined1 local_360;
  allocator local_351;
  string local_350 [36];
  int local_32c;
  _Base_ptr local_328;
  undefined1 local_320;
  allocator local_311;
  string local_310 [36];
  int local_2ec;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  allocator local_2d1;
  string local_2d0 [36];
  int local_2ac;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_291;
  string local_290 [36];
  int local_26c;
  _Base_ptr local_268;
  undefined1 local_260;
  allocator local_251;
  string local_250 [36];
  int local_22c;
  _Base_ptr local_228;
  undefined1 local_220;
  allocator local_211;
  string local_210 [36];
  int local_1ec;
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  allocator local_1d1;
  string local_1d0 [36];
  int local_1ac;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  allocator local_191;
  string local_190 [36];
  int local_16c;
  _Base_ptr local_168;
  undefined1 local_160;
  allocator local_151;
  string local_150 [36];
  int local_12c;
  _Base_ptr local_128;
  undefined1 local_120;
  allocator local_111;
  string local_110 [36];
  int local_ec;
  _Base_ptr local_e8;
  undefined1 local_e0;
  allocator local_d1;
  string local_d0 [36];
  int local_ac;
  _Base_ptr local_a8;
  undefined1 local_a0;
  allocator local_91;
  string local_90 [36];
  int local_6c;
  _Base_ptr local_68;
  undefined1 local_60;
  allocator local_41;
  string local_40 [32];
  int local_20;
  cartesian4 local_1c;
  uint local_c;
  
  for (local_c = 0; dVar3 = (double)(int)local_c, dVar4 = pow((double)*(int *)(in_RDI + 8),3.0),
      dVar3 < dVar4; local_c = local_c + 1) {
    std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
              ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f02a);
    local_1c = Lattice::indexToCoordinate
                         ((Lattice *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                          (int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    if ((((local_1c.z != 0) && (local_1c.y != 0)) && (local_1c.y != *(int *)(in_RDI + 8) + -1)) &&
       ((local_1c.x + local_1c.y + local_1c.z) % 2 == *(int *)(in_RDI + 0x1d0))) {
      if (local_1c.z == 1) {
        if (local_1c.x != 0) {
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f0e8);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_40,"yz",&local_41);
          local_20 = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_40,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_68 = (_Base_ptr)pVar5.first._M_node;
          local_60 = pVar5.second;
          std::__cxx11::string::~string(local_40);
          std::allocator<char>::~allocator((allocator<char> *)&local_41);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f1eb);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90,"xy",&local_91);
          local_6c = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_90,0xffffffff);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_a8 = (_Base_ptr)pVar5.first._M_node;
          local_a0 = pVar5.second;
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        if (local_1c.x != *(int *)(in_RDI + 8) + -1) {
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f3a2);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d0,"xyz",&local_d1);
          local_ac = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_d0,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_e8 = (_Base_ptr)pVar5.first._M_node;
          local_e0 = pVar5.second;
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f4a5);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_110,"xz",&local_111);
          local_ec = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_110,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_128 = (_Base_ptr)pVar5.first._M_node;
          local_120 = pVar5.second;
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
        }
      }
      else if (local_1c.z == *(int *)(in_RDI + 8) + -1) {
        if (local_1c.x != 0) {
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f66f);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_150,"xyz",&local_151);
          local_12c = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_150,0xffffffff);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_168 = (_Base_ptr)pVar5.first._M_node;
          local_160 = pVar5.second;
          std::__cxx11::string::~string(local_150);
          std::allocator<char>::~allocator((allocator<char> *)&local_151);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f772);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_190,"xz",&local_191);
          local_16c = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_190,0xffffffff);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_1a8 = (_Base_ptr)pVar5.first._M_node;
          local_1a0 = pVar5.second;
          std::__cxx11::string::~string(local_190);
          std::allocator<char>::~allocator((allocator<char> *)&local_191);
        }
        if (local_1c.x != *(int *)(in_RDI + 8) + -1) {
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13f929);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d0,"yz",&local_1d1);
          local_1ac = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_1d0,0xffffffff);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_1e8 = (_Base_ptr)pVar5.first._M_node;
          local_1e0 = pVar5.second;
          std::__cxx11::string::~string(local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13fa2c);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_210,"xy",&local_211);
          local_1ec = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_210,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_228 = (_Base_ptr)pVar5.first._M_node;
          local_220 = pVar5.second;
          std::__cxx11::string::~string(local_210);
          std::allocator<char>::~allocator((allocator<char> *)&local_211);
        }
      }
      else {
        if (local_1c.x != 0) {
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13fbd9);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_250,"xyz",&local_251);
          local_22c = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_250,0xffffffff);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_268 = (_Base_ptr)pVar5.first._M_node;
          local_260 = pVar5.second;
          std::__cxx11::string::~string(local_250);
          std::allocator<char>::~allocator((allocator<char> *)&local_251);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13fcdc);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_290,"xy",&local_291);
          local_26c = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_290,0xffffffff);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_2a8 = (_Base_ptr)pVar5.first._M_node;
          local_2a0 = pVar5.second;
          std::__cxx11::string::~string(local_290);
          std::allocator<char>::~allocator((allocator<char> *)&local_291);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13fddf);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2d0,"xz",&local_2d1);
          local_2ac = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_2d0,0xffffffff);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_2e8 = (_Base_ptr)pVar5.first._M_node;
          local_2e0 = pVar5.second;
          std::__cxx11::string::~string(local_2d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x13fee2);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_310,"yz",&local_311);
          local_2ec = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_310,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_328 = (_Base_ptr)pVar5.first._M_node;
          local_320 = pVar5.second;
          std::__cxx11::string::~string(local_310);
          std::allocator<char>::~allocator((allocator<char> *)&local_311);
        }
        if (local_1c.x != *(int *)(in_RDI + 8) + -1) {
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x14012b);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_350,"xyz",&local_351);
          local_32c = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_350,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_368 = (_Base_ptr)pVar5.first._M_node;
          local_360 = pVar5.second;
          std::__cxx11::string::~string(local_350);
          std::allocator<char>::~allocator((allocator<char> *)&local_351);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x14022e);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_390,"xy",&local_391);
          local_36c = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_390,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_3a8 = (_Base_ptr)pVar5.first._M_node;
          local_3a0 = pVar5.second;
          std::__cxx11::string::~string(local_390);
          std::allocator<char>::~allocator((allocator<char> *)&local_391);
          pLVar2 = std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                             ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x140322);
          uVar1 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3d0,"xz",&local_3d1);
          local_3ac = (*pLVar2->_vptr_Lattice[2])(pLVar2,(ulong)uVar1,local_3d0,1);
          pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                             (value_type_conflict1 *)in_stack_fffffffffffff868);
          local_3e8 = (_Base_ptr)pVar5.first._M_node;
          local_3e0 = pVar5.second;
          std::__cxx11::string::~string(local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
          in_stack_fffffffffffff868 =
               std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                         ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x1403fb);
          in_stack_fffffffffffff874 = local_c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_410,"yz",&local_411);
          local_3ec = (*in_stack_fffffffffffff868->_vptr_Lattice[2])
                                (in_stack_fffffffffffff868,(ulong)in_stack_fffffffffffff874,
                                 local_410,0xffffffff);
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                     (value_type_conflict1 *)in_stack_fffffffffffff868);
          std::__cxx11::string::~string(local_410);
          std::allocator<char>::~allocator((allocator<char> *)&local_411);
        }
      }
    }
  }
  return;
}

Assistant:

void RhombicCode::buildSyndromeIndices()
{
    for (int i = 0; i < pow(l, 3); ++i)
    {
        const cartesian4 coordinate = lattice->indexToCoordinate(i);
        if (coordinate.z == 0 || coordinate.y == 0 || coordinate.y == l - 1)
        {
            continue;
        }
        else
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == latticeParity)
            {
                if (coordinate.z == 1)
                {
                    if (coordinate.x != 0)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", -1));
                    }
                    if (coordinate.x != l - 1)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", 1));
                    }
                }
                else if (coordinate.z == l - 1)
                {
                    if (coordinate.x != 0)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", -1));
                    }
                    if (coordinate.x != l - 1)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", 1));
                    }
                }
                else
                {
                    if (coordinate.x != 0)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", 1));
                    }
                    if (coordinate.x != l - 1)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", -1));
                    }
                }
            }
        }
    }
}